

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglwindow.cpp
# Opt level: O3

void __thiscall QOpenGLWindowPrivate::~QOpenGLWindowPrivate(QOpenGLWindowPrivate *this)

{
  QOffscreenSurface *pQVar1;
  QOpenGLWindowPaintDevice *pQVar2;
  QOpenGLFramebufferObject *pQVar3;
  QOpenGLContext *pQVar4;
  
  *(undefined ***)this = &PTR__QOpenGLWindowPrivate_001a16f8;
  pQVar1 = (this->offscreenSurface).d;
  if (pQVar1 != (QOffscreenSurface *)0x0) {
    (**(code **)(*(long *)pQVar1 + 0x20))();
  }
  QOpenGLTextureBlitter::~QOpenGLTextureBlitter(&this->blitter);
  pQVar2 = (this->paintDevice).d;
  if (pQVar2 != (QOpenGLWindowPaintDevice *)0x0) {
    (**(code **)(*(long *)&pQVar2->super_QOpenGLPaintDevice + 8))();
  }
  pQVar3 = (this->fbo).d;
  if (pQVar3 != (QOpenGLFramebufferObject *)0x0) {
    (*pQVar3->_vptr_QOpenGLFramebufferObject[1])();
  }
  pQVar4 = (this->context).d;
  if (pQVar4 != (QOpenGLContext *)0x0) {
    (**(code **)(*(long *)pQVar4 + 0x20))();
  }
  QPaintDeviceWindowPrivate::~QPaintDeviceWindowPrivate(&this->super_QPaintDeviceWindowPrivate);
  return;
}

Assistant:

QOpenGLWindowPrivate::~QOpenGLWindowPrivate()
{
}